

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreport.h
# Opt level: O0

char * guessprocessor(void)

{
  char *codename;
  uint edx;
  uint ecx;
  uint ebx;
  uint eax;
  char *local_18;
  uint local_10 [4];
  
  local_10[3] = 1;
  local_10[2] = 0;
  local_10[1] = 0;
  local_10[0] = 0;
  native_cpuid(local_10 + 3,local_10 + 2,local_10 + 1,local_10);
  local_10[3] = local_10[3] >> 4;
  if (local_10[3] - 99 < 2) {
    return "Prescott";
  }
  if (local_10[3] == 0x66) {
    return "Presler";
  }
  if (local_10[3] == 0x6d) {
    return "Dothan";
  }
  if (local_10[3] == 0x6f) {
LAB_00102911:
    return "Merom";
  }
  if (local_10[3] == 0x16c) {
    return "Pineview";
  }
  if (local_10[3] == 0x266) {
    return "Lincroft";
  }
  if (local_10[3] == 0x366) {
    return "Cedarview";
  }
  if (local_10[3] == 0x1066) goto LAB_00102911;
  if (local_10[3] == 0x1067) {
LAB_001027cc:
    local_18 = "Penryn";
  }
  else {
    if (local_10[3] != 0x106a) {
      if (local_10[3] == 0x106d) goto LAB_001027cc;
      if (local_10[3] != 0x106e) {
        if (local_10[3] == 0x2065) {
LAB_00102911:
          return "Westmere";
        }
        if (local_10[3] == 0x206a) {
LAB_00102911:
          return "SandyBridge";
        }
        if (local_10[3] == 0x206c) goto LAB_00102911;
        if (local_10[3] == 0x206d) goto LAB_00102911;
        if (local_10[3] != 0x206e) {
          if (local_10[3] == 0x206f) goto LAB_00102911;
          if (local_10[3] == 0x306a) {
            return "IvyBridge";
          }
          if (local_10[3] == 0x306c) {
            return "Haswell";
          }
          if (local_10[3] == 0x306d) {
            return "Broadwell";
          }
          if (local_10[3] == 0x30f1) goto LAB_00102911;
          if (local_10[3] == 0x406c) {
            return "CherryTrail";
          }
          if (local_10[3] == 0x506c) {
LAB_00102911:
            return "Goldmont";
          }
          if (local_10[3] == 0x506e) {
            return "Skylake";
          }
          if (local_10[3] == 0x606a) {
LAB_00102911:
            return "Icelake";
          }
          if ((local_10[3] == 0x60f0) || (local_10[3] == 0x60f8)) goto LAB_00102911;
          if (local_10[3] == 0x706a) goto LAB_00102911;
          if (local_10[3] == 0x706e) goto LAB_00102911;
          if (local_10[3] == 0x70f1) {
LAB_00102911:
            return "Zen2";
          }
          if (local_10[3] - 0x806c < 2) {
            return "TigerLake";
          }
          if (local_10[3] != 0x806e) {
            if ((local_10[3] == 0x9067) || (local_10[3] == 0x906a)) {
              return "Alderlake";
            }
            if (local_10[3] != 0x906e) {
              if (local_10[3] != 0x90f0) {
                if (local_10[3] - 0xa065 < 2) {
                  return "Cometlake";
                }
                if (local_10[3] == 0xa067) {
                  return "Rocketlake";
                }
                if (local_10[3] == 0xb067) {
                  return "Raptorlake";
                }
                if (local_10[3] != 0x20f10) {
                  if (local_10[3] == 0x40f40) {
                    return "Zen3+";
                  }
                  if (local_10[3] != 0x50f00) {
                    if (local_10[3] != 0x60f10) {
                      return "unknown";
                    }
                    return "Zen4";
                  }
                }
                return "Zen3";
              }
              goto LAB_00102911;
            }
          }
          return "Kabylake";
        }
      }
    }
    local_18 = "Nehalem";
  }
  return local_18;
}

Assistant:

static inline const char *guessprocessor() {
    unsigned eax = 1, ebx = 0, ecx = 0, edx = 0;
    native_cpuid(&eax, &ebx, &ecx, &edx);
    const char *codename;
    switch (eax >> 4) {
        case 0x506E:
            codename = "Skylake";
            break;
        case 0x406C:
            codename = "CherryTrail";
            break;
        case 0x306D:
            codename = "Broadwell";
            break;
        case 0x306C:
            codename = "Haswell";
            break;
        case 0x306A:
            codename = "IvyBridge";
            break;
        case 0x206A:
        case 0x206D:
            codename = "SandyBridge";
            break;
        case 0x2065:
        case 0x206C:
        case 0x206F:
            codename = "Westmere";
            break;
        case 0x106E:
        case 0x106A:
        case 0x206E:
            codename = "Nehalem";
            break;
        case 0x1067:
        case 0x106D:
            codename = "Penryn";
            break;
        case 0x006F:
        case 0x1066:
            codename = "Merom";
            break;
        case 0x0066:
            codename = "Presler";
            break;
        case 0x0063:
        case 0x0064:
            codename = "Prescott";
            break;
        case 0x006D:
            codename = "Dothan";
            break;
        case 0x0366:
            codename = "Cedarview";
            break;
        case 0x0266:
            codename = "Lincroft";
            break;
        case 0x016C:
            codename = "Pineview";
            break;
        case 0x706e:
        case 0x606a:
            codename = "Icelake";
            break;
        case 0x706a:
        case 0x506c:
            codename = "Goldmont";
            break;
        case 0x806c:
        case 0x806d:
            codename = "TigerLake";
            break;
        case 0x806e:
        case 0x906e:
            codename = "Kabylake";
            break;
        case 0xa065:
        case 0xa066:
            codename = "Cometlake";
            break;
        case 0xa067:
            codename = "Rocketlake";
            break;
        case 0x9067:
        case 0x906a:
            codename = "Alderlake";
            break;
        case 0xb067:
            codename = "Raptorlake";
            break;
        case 0x30f1:
        case 0x60f0:
        case 0x70f1:
        case 0x60f8:
        case 0x90f0:
            codename = "Zen2";
            break;
        case 0x20f10:
        case 0x50f00:
            codename = "Zen3";
            break;
        case 0x40f40:
            codename = "Zen3+";
            break;
        case 0x60f10:
            codename = "Zen4";
            break;
        default:
            codename = "unknown";
            break;
    }
    return codename;
}